

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memxor.c
# Opt level: O0

void memxor(uint8_t *out,uint8_t *in1,uint8_t *in2,size_t size)

{
  ulong local_28;
  size_t size_local;
  uint8_t *in2_local;
  uint8_t *in1_local;
  uint8_t *out_local;
  
  local_28 = size;
  size_local = (size_t)in2;
  in2_local = in1;
  in1_local = out;
  switch((uint)size & 0xf) {
  case 0:
    size_local = (size_t)in2;
    in2_local = in1;
    in1_local = out;
    while (0xf < local_28) {
      local_28 = local_28 - 0x10;
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_f:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_e:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_d:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_c:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_b:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_a:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_9:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_8:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_7:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_6:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_5:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_4:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_3:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_2:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
switchD_0014212b_caseD_1:
      *in1_local = *in2_local ^ *(byte *)size_local;
      size_local = size_local + 1;
      in2_local = in2_local + 1;
      in1_local = in1_local + 1;
    }
    break;
  case 1:
    goto switchD_0014212b_caseD_1;
  case 2:
    goto switchD_0014212b_caseD_2;
  case 3:
    goto switchD_0014212b_caseD_3;
  case 4:
    goto switchD_0014212b_caseD_4;
  case 5:
    goto switchD_0014212b_caseD_5;
  case 6:
    goto switchD_0014212b_caseD_6;
  case 7:
    goto switchD_0014212b_caseD_7;
  case 8:
    goto switchD_0014212b_caseD_8;
  case 9:
    goto switchD_0014212b_caseD_9;
  case 10:
    goto switchD_0014212b_caseD_a;
  case 0xb:
    goto switchD_0014212b_caseD_b;
  case 0xc:
    goto switchD_0014212b_caseD_c;
  case 0xd:
    goto switchD_0014212b_caseD_d;
  case 0xe:
    goto switchD_0014212b_caseD_e;
  case 0xf:
    goto switchD_0014212b_caseD_f;
  }
  return;
}

Assistant:

void memxor(uint8_t *out, const uint8_t *in1, const uint8_t *in2, size_t size)
{
    switch (size & 15) {
      case 0:
        while (size >= 16) {
            size -= 16;
                   *out++ = *in1++ ^ *in2++;
          case 15: *out++ = *in1++ ^ *in2++;
          case 14: *out++ = *in1++ ^ *in2++;
          case 13: *out++ = *in1++ ^ *in2++;
          case 12: *out++ = *in1++ ^ *in2++;
          case 11: *out++ = *in1++ ^ *in2++;
          case 10: *out++ = *in1++ ^ *in2++;
          case 9:  *out++ = *in1++ ^ *in2++;
          case 8:  *out++ = *in1++ ^ *in2++;
          case 7:  *out++ = *in1++ ^ *in2++;
          case 6:  *out++ = *in1++ ^ *in2++;
          case 5:  *out++ = *in1++ ^ *in2++;
          case 4:  *out++ = *in1++ ^ *in2++;
          case 3:  *out++ = *in1++ ^ *in2++;
          case 2:  *out++ = *in1++ ^ *in2++;
          case 1:  *out++ = *in1++ ^ *in2++;
        }
    }
}